

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

bool __thiscall
Js::DynamicProfileInfo::MayHaveNonBuiltinCallee(DynamicProfileInfo *this,ProfileId callSiteId)

{
  ushort uVar1;
  CallSiteInfo *pCVar2;
  bool bVar3;
  undefined2 in_register_00000032;
  
  CCLock::Enter((CCLock *)&callSiteInfoCS);
  pCVar2 = (this->callSiteInfo).ptr;
  uVar1 = *(ushort *)(&pCVar2->field_0x2 + (uint)(CONCAT22(in_register_00000032,callSiteId) << 4));
  bVar3 = true;
  if ((((uVar1 >> 0xe & 1) == 0) && (-1 < (short)uVar1)) &&
     (*(int *)((long)&pCVar2->u + (ulong)(uint)(CONCAT22(in_register_00000032,callSiteId) << 4)) ==
      -2)) {
    bVar3 = false;
  }
  CCLock::Leave((CCLock *)&callSiteInfoCS);
  return bVar3;
}

Assistant:

bool DynamicProfileInfo::MayHaveNonBuiltinCallee(ProfileId callSiteId)
    {
        AutoCriticalSection cs(&this->callSiteInfoCS);

        if (this->callSiteInfo[callSiteId].dontInline)
        {
            return true;
        }

        if (!this->callSiteInfo[callSiteId].isPolymorphic)
        {
            Js::SourceId sourceId = this->callSiteInfo[callSiteId].u.functionData.sourceId;
            if (sourceId == BuiltInSourceId)
            {
                return false;
            }
        }

        return true;
    }